

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
chaiscript::json::JSON::JSON<std::__cxx11::string>
          (JSON *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          type *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  type *local_20;
  type *param_2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  JSON *this_local;
  
  local_20 = param_2;
  param_2_local = s;
  s_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::__cxx11::string::string((string *)&local_40,s);
  Internal::Internal<std::__cxx11::string>(&this->internal,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

explicit JSON(T s, typename enable_if<is_convertible<T, std::string>::value>::type * = nullptr)
        : internal(static_cast<std::string>(s)) {
    }